

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

int luaY_nvarstack(FuncState *fs)

{
  int iVar1;
  
  iVar1 = reglevel(fs,(uint)fs->nactvar);
  return iVar1;
}

Assistant:

int luaY_nvarstack (FuncState *fs) {
  return reglevel(fs, fs->nactvar);
}